

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O2

Aig_Man_t * Saig_ManWindowInsert(Aig_Man_t *p,Aig_Obj_t *pObj,int nDist,Aig_Man_t *pWnd)

{
  Vec_Ptr_t *vNodes;
  Aig_Man_t *pAVar1;
  
  Aig_ManFanoutStart(p);
  vNodes = Saig_ManWindowOutline(p,pObj,nDist);
  pAVar1 = Saig_ManWindowExtractNodes(p,vNodes);
  if ((pAVar1->nTruePis == pWnd->nTruePis) && (pAVar1->nTruePos == pWnd->nTruePos)) {
    Aig_ManStop(pAVar1);
    Vec_PtrFree(vNodes);
    Aig_ManCleanData(p);
    vNodes = Saig_ManWindowOutline(p,pObj,nDist);
    pAVar1 = Saig_ManWindowInsertNodes(p,vNodes,pWnd);
  }
  else {
    puts("The window cannot be reinserted because PI/PO counts do not match.");
    Aig_ManStop(pAVar1);
    pAVar1 = (Aig_Man_t *)0x0;
  }
  Vec_PtrFree(vNodes);
  Aig_ManFanoutStop(p);
  return pAVar1;
}

Assistant:

Aig_Man_t * Saig_ManWindowInsert( Aig_Man_t * p, Aig_Obj_t * pObj, int nDist, Aig_Man_t * pWnd )
{
    Aig_Man_t * pNew, * pWndTest;
    Vec_Ptr_t * vNodes;
    Aig_ManFanoutStart( p );

    vNodes = Saig_ManWindowOutline( p, pObj, nDist );
    pWndTest = Saig_ManWindowExtractNodes( p, vNodes );
    if ( Saig_ManPiNum(pWndTest) != Saig_ManPiNum(pWnd) ||
         Saig_ManPoNum(pWndTest) != Saig_ManPoNum(pWnd) )
    {
        printf( "The window cannot be reinserted because PI/PO counts do not match.\n" );
        Aig_ManStop( pWndTest );
        Vec_PtrFree( vNodes );
        Aig_ManFanoutStop( p );
        return NULL;
    }
    Aig_ManStop( pWndTest );
    Vec_PtrFree( vNodes );

    // insert the nodes
    Aig_ManCleanData( p ); 
    vNodes = Saig_ManWindowOutline( p, pObj, nDist );
    pNew = Saig_ManWindowInsertNodes( p, vNodes, pWnd );
    Vec_PtrFree( vNodes );
    Aig_ManFanoutStop( p );
    return pNew;
}